

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall
cbtQuantizedBvh::deSerializeFloat
          (cbtQuantizedBvh *this,cbtQuantizedBvhFloatData *quantizedBvhFloatData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  int iVar4;
  cbtQuantizedBvhNode *ptr;
  cbtQuantizedBvhNodeData *pcVar5;
  cbtBvhSubtreeInfo *ptr_00;
  cbtBvhSubtreeInfoData *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int i;
  long lVar14;
  cbtOptimizedBvhNode *pcVar15;
  cbtOptimizedBvhNodeFloatData *pcVar16;
  cbtQuantizedBvhNode *pcVar17;
  cbtBvhSubtreeInfo *pcVar18;
  long lVar19;
  int *piVar20;
  int i_3;
  ulong uVar21;
  cbtOptimizedBvhNode *pcVar22;
  int i_4;
  
  lVar14 = 0;
  do {
    (this->m_bvhAabbMax).m_floats[lVar14] = (quantizedBvhFloatData->m_bvhAabbMax).m_floats[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  lVar14 = 0;
  do {
    (this->m_bvhAabbMin).m_floats[lVar14] = (quantizedBvhFloatData->m_bvhAabbMin).m_floats[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  lVar14 = 0;
  do {
    (this->m_bvhQuantization).m_floats[lVar14] =
         (quantizedBvhFloatData->m_bvhQuantization).m_floats[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 4);
  this->m_curNodeIndex = quantizedBvhFloatData->m_curNodeIndex;
  this->m_useQuantization = quantizedBvhFloatData->m_useQuantization != 0;
  uVar3 = quantizedBvhFloatData->m_numContiguousLeafNodes;
  iVar4 = (this->m_contiguousNodes).m_size;
  if ((iVar4 <= (int)uVar3) && (iVar4 < (int)uVar3)) {
    if ((this->m_contiguousNodes).m_capacity < (int)uVar3) {
      if (uVar3 == 0) {
        pcVar15 = (cbtOptimizedBvhNode *)0x0;
      }
      else {
        pcVar15 = (cbtOptimizedBvhNode *)cbtAlignedAllocInternal((long)(int)uVar3 << 6,0x10);
      }
      lVar14 = (long)(this->m_contiguousNodes).m_size;
      if (0 < lVar14) {
        lVar19 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar19);
          uVar7 = puVar1[1];
          uVar8 = puVar1[2];
          uVar9 = puVar1[3];
          uVar10 = puVar1[4];
          uVar11 = puVar1[5];
          uVar12 = puVar1[6];
          uVar13 = puVar1[7];
          puVar2 = (undefined8 *)((long)(pcVar15->m_aabbMinOrg).m_floats + lVar19);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          puVar2[2] = uVar8;
          puVar2[3] = uVar9;
          puVar2[4] = uVar10;
          puVar2[5] = uVar11;
          puVar2[6] = uVar12;
          puVar2[7] = uVar13;
          lVar19 = lVar19 + 0x40;
        } while (lVar14 * 0x40 != lVar19);
      }
      pcVar22 = (this->m_contiguousNodes).m_data;
      if (pcVar22 != (cbtOptimizedBvhNode *)0x0) {
        if ((this->m_contiguousNodes).m_ownsMemory == true) {
          cbtAlignedFreeInternal(pcVar22);
        }
        (this->m_contiguousNodes).m_data = (cbtOptimizedBvhNode *)0x0;
      }
      (this->m_contiguousNodes).m_ownsMemory = true;
      (this->m_contiguousNodes).m_data = pcVar15;
      (this->m_contiguousNodes).m_capacity = uVar3;
    }
    if (iVar4 < (int)uVar3) {
      lVar14 = (long)(int)uVar3 - (long)iVar4;
      lVar19 = (long)iVar4 << 6;
      do {
        puVar1 = (undefined8 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMinOrg).m_floats + lVar19);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1[2] = 0;
        puVar1[3] = 0;
        puVar1[4] = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        puVar1[7] = 0;
        lVar19 = lVar19 + 0x40;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
  }
  (this->m_contiguousNodes).m_size = uVar3;
  if (0 < (int)uVar3) {
    pcVar16 = quantizedBvhFloatData->m_contiguousNodesPtr;
    pcVar15 = (this->m_contiguousNodes).m_data;
    uVar21 = 0;
    pcVar22 = pcVar15;
    do {
      lVar14 = 4;
      do {
        (pcVar22->m_aabbMinOrg).m_floats[lVar14] = (pcVar16->m_aabbMinOrg).m_floats[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 8);
      lVar14 = 0;
      do {
        (pcVar22->m_aabbMinOrg).m_floats[lVar14] = (pcVar16->m_aabbMinOrg).m_floats[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
      pcVar15[uVar21].m_escapeIndex = pcVar16->m_escapeIndex;
      pcVar15[uVar21].m_subPart = pcVar16->m_subPart;
      pcVar15[uVar21].m_triangleIndex = pcVar16->m_triangleIndex;
      uVar21 = uVar21 + 1;
      pcVar16 = pcVar16 + 1;
      pcVar22 = pcVar22 + 1;
    } while (uVar21 != uVar3);
  }
  uVar3 = quantizedBvhFloatData->m_numQuantizedContiguousNodes;
  iVar4 = (this->m_quantizedContiguousNodes).m_size;
  if ((iVar4 <= (int)uVar3) && (iVar4 < (int)uVar3)) {
    if ((this->m_quantizedContiguousNodes).m_capacity < (int)uVar3) {
      if (uVar3 == 0) {
        pcVar17 = (cbtQuantizedBvhNode *)0x0;
      }
      else {
        pcVar17 = (cbtQuantizedBvhNode *)cbtAlignedAllocInternal((long)(int)uVar3 << 4,0x10);
      }
      lVar14 = (long)(this->m_quantizedContiguousNodes).m_size;
      if (0 < lVar14) {
        lVar19 = 0;
        do {
          puVar1 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar19);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)pcVar17->m_quantizedAabbMin + lVar19);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          lVar19 = lVar19 + 0x10;
        } while (lVar14 * 0x10 != lVar19);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if (ptr != (cbtQuantizedBvhNode *)0x0) {
        if ((this->m_quantizedContiguousNodes).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_quantizedContiguousNodes).m_data = (cbtQuantizedBvhNode *)0x0;
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pcVar17;
      (this->m_quantizedContiguousNodes).m_capacity = uVar3;
    }
    if (iVar4 < (int)uVar3) {
      lVar14 = (long)(int)uVar3 - (long)iVar4;
      lVar19 = (long)iVar4 << 4;
      do {
        puVar1 = (undefined8 *)
                 ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar19);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar19 = lVar19 + 0x10;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
  }
  (this->m_quantizedContiguousNodes).m_size = uVar3;
  if (0 < (int)uVar3) {
    pcVar5 = quantizedBvhFloatData->m_quantizedContiguousNodesPtr;
    pcVar17 = (this->m_quantizedContiguousNodes).m_data;
    lVar14 = 0;
    do {
      *(undefined4 *)((long)pcVar17->m_quantizedAabbMax + lVar14 + 6) =
           *(undefined4 *)((long)pcVar5->m_quantizedAabbMax + lVar14 + 6);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMax + lVar14) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMax + lVar14);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMax + lVar14 + 2) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMax + lVar14 + 2);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMax + lVar14 + 4) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMax + lVar14 + 4);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMin + lVar14) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMin + lVar14);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMin + lVar14 + 2) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMin + lVar14 + 2);
      *(undefined2 *)((long)pcVar17->m_quantizedAabbMin + lVar14 + 4) =
           *(undefined2 *)((long)pcVar5->m_quantizedAabbMin + lVar14 + 4);
      lVar14 = lVar14 + 0x10;
    } while ((ulong)uVar3 << 4 != lVar14);
  }
  this->m_traversalMode = quantizedBvhFloatData->m_traversalMode;
  uVar3 = quantizedBvhFloatData->m_numSubtreeHeaders;
  if (((this->m_SubtreeHeaders).m_size < (int)uVar3) &&
     ((this->m_SubtreeHeaders).m_capacity < (int)uVar3)) {
    if (uVar3 == 0) {
      pcVar18 = (cbtBvhSubtreeInfo *)0x0;
    }
    else {
      pcVar18 = (cbtBvhSubtreeInfo *)cbtAlignedAllocInternal((long)(int)uVar3 << 5,0x10);
    }
    lVar14 = (long)(this->m_SubtreeHeaders).m_size;
    if (0 < lVar14) {
      lVar19 = 0;
      do {
        puVar1 = (undefined8 *)
                 ((long)((this->m_SubtreeHeaders).m_data)->m_quantizedAabbMin + lVar19);
        uVar7 = puVar1[1];
        uVar8 = puVar1[2];
        uVar9 = puVar1[3];
        puVar2 = (undefined8 *)((long)pcVar18->m_quantizedAabbMin + lVar19);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        puVar2[2] = uVar8;
        puVar2[3] = uVar9;
        lVar19 = lVar19 + 0x20;
      } while (lVar14 * 0x20 != lVar19);
    }
    ptr_00 = (this->m_SubtreeHeaders).m_data;
    if (ptr_00 != (cbtBvhSubtreeInfo *)0x0) {
      if ((this->m_SubtreeHeaders).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr_00);
      }
      (this->m_SubtreeHeaders).m_data = (cbtBvhSubtreeInfo *)0x0;
    }
    (this->m_SubtreeHeaders).m_ownsMemory = true;
    (this->m_SubtreeHeaders).m_data = pcVar18;
    (this->m_SubtreeHeaders).m_capacity = uVar3;
  }
  (this->m_SubtreeHeaders).m_size = uVar3;
  if (0 < (int)uVar3) {
    pcVar6 = quantizedBvhFloatData->m_subTreeInfoPtr;
    piVar20 = &((this->m_SubtreeHeaders).m_data)->m_subtreeSize;
    lVar14 = 0;
    do {
      *(unsigned_short *)((long)piVar20 + -10) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMax + lVar14);
      *(unsigned_short *)(piVar20 + -2) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMax + lVar14 + 2);
      *(unsigned_short *)((long)piVar20 + -6) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMax + lVar14 + 4);
      ((cbtBvhSubtreeInfo *)(piVar20 + -4))->m_quantizedAabbMin[0] =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMin + lVar14);
      *(unsigned_short *)((long)piVar20 + -0xe) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMin + lVar14 + 2);
      *(unsigned_short *)(piVar20 + -3) =
           *(unsigned_short *)((long)pcVar6->m_quantizedAabbMin + lVar14 + 4);
      piVar20[-1] = *(int *)((long)pcVar6->m_quantizedAabbMin + lVar14 + -8);
      *piVar20 = *(int *)((long)pcVar6->m_quantizedAabbMin + lVar14 + -4);
      piVar20 = piVar20 + 8;
      lVar14 = lVar14 + 0x14;
    } while ((ulong)uVar3 * 0x14 != lVar14);
  }
  return;
}

Assistant:

void cbtQuantizedBvh::deSerializeFloat(struct cbtQuantizedBvhFloatData& quantizedBvhFloatData)
{
	m_bvhAabbMax.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeFloat(quantizedBvhFloatData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeFloat(quantizedBvhFloatData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhFloatData.m_curNodeIndex;
	m_useQuantization = quantizedBvhFloatData.m_useQuantization != 0;

	{
		int numElem = quantizedBvhFloatData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			cbtOptimizedBvhNodeFloatData* memPtr = quantizedBvhFloatData.m_contiguousNodesPtr;

			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeFloat(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeFloat(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhFloatData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);

		if (numElem)
		{
			cbtQuantizedBvhNodeData* memPtr = quantizedBvhFloatData.m_quantizedContiguousNodesPtr;
			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = cbtTraversalMode(quantizedBvhFloatData.m_traversalMode);

	{
		int numElem = quantizedBvhFloatData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			cbtBvhSubtreeInfoData* memPtr = quantizedBvhFloatData.m_subTreeInfoPtr;
			for (int i = 0; i < numElem; i++, memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}
}